

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * CTcPrsOpUnary::parse_inherited(void)

{
  _func_int **pp_Var1;
  tc_toktyp_t tVar2;
  CTcPrsNode *pCVar3;
  CTcFormalTypeList *this;
  int iVar4;
  size_t in_RSI;
  CTcTokenizer *this_00;
  
  tVar2 = CTcTokenizer::next(G_tok);
  if (tVar2 == TOKT_LT) {
    this = (CTcFormalTypeList *)CTcPrsMem::alloc(G_prsmem,0x18);
    this->head_ = (CTcFormalTypeEle *)0x0;
    this->tail_ = (CTcFormalTypeEle *)0x0;
    this->varargs_ = 0;
LAB_0022f02e:
    CTcTokenizer::next(G_tok);
    do {
      this_00 = G_tok;
      tVar2 = (G_tok->curtok_).typ_;
      if (tVar2 == TOKT_SYM) {
        this_00 = (CTcTokenizer *)&G_tok->curtok_;
        CTcFormalTypeList::add_typed_param(this,(CTcToken *)this_00);
      }
      else {
        if (tVar2 == TOKT_COMMA) {
          iVar4 = 0x2bcb;
          goto LAB_0022f0b1;
        }
        if (tVar2 != TOKT_TIMES) {
          if (tVar2 == TOKT_EOF) goto LAB_0022f122;
          if (tVar2 != TOKT_LPAR) {
            if (tVar2 == TOKT_RPAR) {
LAB_0022f122:
              CTcTokenizer::log_error_curtok(G_tok,0x2bcb);
              return (CTcPrsNode *)0x0;
            }
            if (tVar2 != TOKT_ELLIPSIS) {
              if (tVar2 == TOKT_SEM) goto LAB_0022f122;
              if (tVar2 == TOKT_GT) goto LAB_0022f15c;
              iVar4 = 0x2bcb;
              goto LAB_0022f193;
            }
            this->varargs_ = 1;
            tVar2 = CTcTokenizer::next(this_00);
            if (tVar2 == TOKT_GT) goto LAB_0022f15c;
          }
          this_00 = (CTcTokenizer *)0x2bcd;
          CTcTokenizer::log_error_curtok(G_tok,0x2bcd);
          goto LAB_0022f161;
        }
        CTcFormalTypeList::add_untyped_param(this);
      }
      tVar2 = CTcTokenizer::next(G_tok);
      if (tVar2 != TOKT_SYM) {
        if (tVar2 == TOKT_COMMA) goto LAB_0022f02e;
        if ((tVar2 != TOKT_TIMES) && (tVar2 != TOKT_ELLIPSIS)) goto LAB_0022f0a0;
      }
      CTcTokenizer::log_error_curtok(G_tok,0x2bcc);
    } while( true );
  }
  if (tVar2 == TOKT_SYM) {
    pCVar3 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,in_RSI);
    pp_Var1 = (_func_int **)(G_tok->curtok_).text_len_;
    pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)(G_tok->curtok_).text_;
    pCVar3[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
    (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_003503c8;
    G_prs->full_method_ctx_referenced_ = 1;
    CTcTokenizer::next(G_tok);
  }
  else {
    pCVar3 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,in_RSI);
    pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
    (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00355af8;
    G_prs->full_method_ctx_referenced_ = 1;
  }
LAB_0022f0ed:
  pCVar3 = parse_member(pCVar3);
  return pCVar3;
LAB_0022f0a0:
  if (tVar2 == TOKT_GT) goto LAB_0022f15c;
  iVar4 = 0x2bcc;
LAB_0022f0b1:
  CTcTokenizer::log_error_curtok(G_tok,iVar4);
  goto LAB_0022f02e;
LAB_0022f15c:
  CTcTokenizer::next(G_tok);
LAB_0022f161:
  pCVar3 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,(size_t)this_00);
  (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00355af8;
  pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)this;
  if ((G_tok->curtok_).typ_ != TOKT_LPAR) {
    iVar4 = 0x2bce;
LAB_0022f193:
    CTcTokenizer::log_error_curtok(G_tok,iVar4);
    CTcParser::skip_to_sem();
    return (CTcPrsNode *)0x0;
  }
  goto LAB_0022f0ed;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_inherited()
{
    CTcPrsNode *lhs;
    
    /* skip the "inherited" keyword and check what follows */
    switch(G_tok->next())
    {
    case TOKT_SYM:
        /* 
         *   it's an "inherited superclass..." expression - set up the
         *   "inherited superclass" node 
         */
        lhs = new CTPNInhClass(G_tok->getcur()->get_text(),
                               G_tok->getcur()->get_text_len());

        /* this passes method context information to the inheritor */
        G_prs->set_full_method_ctx_referenced(TRUE);

        /* skip the superclass token */
        G_tok->next();

        /* parse the member expression portion normally */
        break;

    case TOKT_LT:
        /* 
         *   '<' - this is the start of a multi-method type list.  Parse the
         *   list: type1 ',' type2 ',' ... '>', then the argument list to the
         *   'inherited' call.  
         */
        {
            /* create the formal type list */
            CTcFormalTypeList *tl = new (G_prsmem)CTcFormalTypeList();

            /* skip the '<' */
            G_tok->next();

            /* parse each list element */
            for (int done = FALSE ; !done ; )
            {
                switch (G_tok->cur())
                {
                case TOKT_GT:
                    /* end of the list - skip the '>', and we're done */
                    G_tok->next();
                    done = TRUE;
                    break;

                case TOKT_ELLIPSIS:
                    /* '...' */
                    tl->add_ellipsis();

                    /* this has to be the end of the list */
                    if (G_tok->next() == TOKT_GT)
                        G_tok->next();
                    else
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_GT);

                    /* assume the list ends here in any case */
                    done = TRUE;
                    break;

                case TOKT_SYM:
                    /* a type token - add it to the list */
                    tl->add_typed_param(G_tok->getcur());

                finish_type:
                    /* skip the type token */
                    switch (G_tok->next())
                    {
                    case TOKT_COMMA:
                        /* another type follows */
                        G_tok->next();
                        break;

                    case TOKT_GT:
                        G_tok->next();
                        done = TRUE;
                        break;

                    case TOKT_SYM:
                    case TOKT_ELLIPSIS:
                    case TOKT_TIMES:
                        /* probably just a missing comma */
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_COMMA);
                        break;

                    default:
                        /* anything else is an error */
                        G_tok->log_error_curtok(TCERR_MMINH_MISSING_COMMA);
                        G_tok->next();
                        break;
                    }
                    break;

                case TOKT_TIMES:
                    /* '*' indicates an untyped parameter */
                    tl->add_untyped_param();
                    goto finish_type;

                case TOKT_LPAR:
                    /* probably a missing '>' */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_GT);
                    done = TRUE;
                    break;

                case TOKT_COMMA:
                    /* probably a missing type */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    G_tok->next();
                    break;

                case TOKT_SEM:
                case TOKT_RPAR:
                case TOKT_EOF:
                    /* all of these indicate a premature end of the list */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    return 0;

                default:
                    /* anything else is an error */
                    G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_TYPE);
                    G_prs->skip_to_sem();
                    return 0;
                }
            }

            /* the left-hand side is an "inherited" node, with the arg list */
            lhs = new CTPNInh();
            ((CTPNInh *)lhs)->set_typelist(tl);

            /* an inherited<> expression must have an argument list */
            if (G_tok->cur() != TOKT_LPAR)
            {
                G_tok->log_error_curtok(TCERR_MMINH_MISSING_ARG_LIST);
                G_prs->skip_to_sem();
                return 0;
            }
        }
        break;
        
    default:
        /*
         *   There's no explicit superclass name listed, so the left-hand
         *   side of the '.' expression is the simple "inherited" node. 
         */
        lhs = new CTPNInh();

        /*
         *   Since we don't have an explicit superclass, we'll need the
         *   method context at run-time to establish the next class in
         *   inheritance order.  Flag the need for the full method context.  
         */
        G_prs->set_full_method_ctx_referenced(TRUE);

        /* parse the member expression portion normally */
        break;
    }

    /* parse and return the member expression */
    return parse_member(lhs);
}